

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raassignment_p.h
# Opt level: O3

int __thiscall
asmjit::RAAssignment::verify
          (RAAssignment *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  RAWorkRegs *pRVar1;
  int in_EAX;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = (ulong)(this->_layout).workCount;
  if (uVar2 != 0) {
    pRVar1 = (this->_layout).workRegs;
    uVar4 = 0;
    do {
      uVar5 = (ulong)this->_workToPhysMap[uVar4].physIds[0];
      if (uVar5 != 0xff) {
        if ((pRVar1->super_ZoneVectorBase)._size <= uVar4) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O3/_deps/asmjit-src/src/asmjit/core/../core/../core/../core/../core/zonevector.h"
                     ,0xb2,"i < _size");
        }
        if (uVar4 != *(uint *)(*(long *)((long)this->_physToWorkIds +
                                        (ulong)(*(uint *)(*(long *)((long)(pRVar1->
                                                  super_ZoneVectorBase)._data + uVar4 * 8) + 0x20)
                                                >> 5 & 0x78)) + uVar5 * 4)) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O3/_deps/asmjit-src/src/asmjit/core/../core/../core/raassignment_p.h"
                     ,0x179,"_physToWorkIds[group][physId] == workId");
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  lVar3 = 0;
  do {
    uVar2 = (ulong)*(byte *)((long)this->_physToWorkIds + lVar3 + -0x24);
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        if (((ulong)this->_physToWorkIds[lVar3][uVar4] != 0xffffffff) &&
           (uVar4 != this->_workToPhysMap[this->_physToWorkIds[lVar3][uVar4]].physIds[0])) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O3/_deps/asmjit-src/src/asmjit/core/../core/../core/raassignment_p.h"
                     ,0x185,"_workToPhysMap->physIds[workId] == physId");
        }
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 4) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

ASMJIT_NOINLINE void verify() noexcept {
    // Verify WorkToPhysMap.
    {
      for (uint32_t workId = 0; workId < _layout.workCount; workId++) {
        uint32_t physId = _workToPhysMap->physIds[workId];
        if (physId != kPhysNone) {
          const RAWorkReg* workReg = _layout.workRegs->at(workId);
          uint32_t group = workReg->group();
          ASMJIT_ASSERT(_physToWorkIds[group][physId] == workId);
        }
      }
    }

    // Verify PhysToWorkMap.
    {
      for (uint32_t group = 0; group < BaseReg::kGroupVirt; group++) {
        uint32_t physCount = _layout.physCount[group];
        for (uint32_t physId = 0; physId < physCount; physId++) {
          uint32_t workId = _physToWorkIds[group][physId];
          if (workId != kWorkNone) {
            ASMJIT_ASSERT(_workToPhysMap->physIds[workId] == physId);
          }
        }
      }
    }
  }